

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

counting_iterator
fmt::v9::detail::write_escaped_cp<fmt::v9::detail::counting_iterator,char>
          (counting_iterator out,find_escape_result<char> *escape)

{
  byte *pbVar1;
  bool bVar2;
  counting_iterator cVar3;
  uint uVar4;
  ulong uVar5;
  byte *pbVar6;
  char *pcVar7;
  char *pcVar8;
  undefined1 local_8;
  char acStack_7 [7];
  
  uVar4 = escape->cp;
  uVar5 = (ulong)uVar4;
  if (((uVar5 < 0x28) && ((0x8400002600U >> (uVar5 & 0x3f) & 1) != 0)) || (uVar4 == 0x5c)) {
    cVar3.count_ = out.count_ + 2;
  }
  else {
    if (uVar4 < 0x100) {
      pcVar7 = acStack_7 + 1;
      pcVar8 = acStack_7;
      do {
        uVar4 = (uint)uVar5;
        *pcVar8 = "0123456789abcdef"[uVar4 & 0xf];
        uVar5 = uVar5 >> 4;
        pcVar8 = pcVar8 + -1;
      } while (0xf < uVar4);
    }
    else if (uVar4 < 0x10000) {
      pcVar7 = acStack_7 + 3;
      pcVar8 = acStack_7 + 2;
      do {
        uVar4 = (uint)uVar5;
        *pcVar8 = "0123456789abcdef"[uVar4 & 0xf];
        uVar5 = uVar5 >> 4;
        pcVar8 = pcVar8 + -1;
      } while (0xf < uVar4);
    }
    else {
      if (0x10ffff < uVar4) {
        pbVar6 = (byte *)escape->begin;
        pbVar1 = (byte *)escape->end;
        if ((long)pbVar1 - (long)pbVar6 < 0) {
          assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O3/_deps/fmt-src/include/fmt/core.h"
                      ,0x199,"negative value");
        }
        if (pbVar1 == pbVar6) {
          return (counting_iterator)out.count_;
        }
        do {
          pcVar8 = acStack_7;
          uVar4 = (uint)*pbVar6;
          do {
            *pcVar8 = "0123456789abcdef"[uVar4 & 0xf];
            pcVar8 = pcVar8 + -1;
            bVar2 = 0xf < uVar4;
            uVar4 = uVar4 >> 4;
          } while (bVar2);
          out.count_ = out.count_ + 4;
          pbVar6 = pbVar6 + 1;
        } while (pbVar6 != pbVar1);
        return (counting_iterator)out.count_;
      }
      pcVar8 = acStack_7 + 6;
      do {
        uVar4 = (uint)uVar5;
        *pcVar8 = "0123456789abcdef"[uVar4 & 0xf];
        uVar5 = uVar5 >> 4;
        pcVar8 = pcVar8 + -1;
        pcVar7 = (char *)register0x00000020;
      } while (0xf < uVar4);
    }
    cVar3.count_ = (size_t)(pcVar7 + (out.count_ - (long)&local_8) + 2);
  }
  return (counting_iterator)cVar3.count_;
}

Assistant:

auto write_escaped_cp(OutputIt out, const find_escape_result<Char>& escape)
    -> OutputIt {
  auto c = static_cast<Char>(escape.cp);
  switch (escape.cp) {
  case '\n':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('n');
    break;
  case '\r':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('r');
    break;
  case '\t':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('t');
    break;
  case '"':
    FMT_FALLTHROUGH;
  case '\'':
    FMT_FALLTHROUGH;
  case '\\':
    *out++ = static_cast<Char>('\\');
    break;
  default:
    if (is_utf8()) {
      if (escape.cp < 0x100) {
        return write_codepoint<2, Char>(out, 'x', escape.cp);
      }
      if (escape.cp < 0x10000) {
        return write_codepoint<4, Char>(out, 'u', escape.cp);
      }
      if (escape.cp < 0x110000) {
        return write_codepoint<8, Char>(out, 'U', escape.cp);
      }
    }
    for (Char escape_char : basic_string_view<Char>(
             escape.begin, to_unsigned(escape.end - escape.begin))) {
      out = write_codepoint<2, Char>(out, 'x',
                                     static_cast<uint32_t>(escape_char) & 0xFF);
    }
    return out;
  }
  *out++ = c;
  return out;
}